

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createMaterial_matte(SemanticParser *this,SP *in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  runtime_error *this_01;
  long *plVar6;
  element_type *peVar7;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr this_02;
  _Rb_tree_node_base *p_Var10;
  float fVar11;
  undefined1 auVar12 [16];
  SP SVar13;
  SP mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  string name;
  element_type *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  undefined1 local_108 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  SP *local_e0;
  SemanticParser *local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_118 = (element_type *)0x0;
  local_e0 = in;
  local_d8 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::MatteMaterial,std::allocator<pbrt::MatteMaterial>,std::__cxx11::string&>
            (&_Stack_110,(MatteMaterial **)&local_118,(allocator<pbrt::MatteMaterial> *)&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  std::__shared_ptr<pbrt::MatteMaterial,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::MatteMaterial,pbrt::MatteMaterial>
            ((__shared_ptr<pbrt::MatteMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_118,
             (MatteMaterial *)local_118);
  p_Var10 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var9 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var8._M_pi = extraout_RDX;
  if (p_Var10 != p_Var9) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var10 + 1));
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_a0.first._M_dataplus._M_p,
                 local_a0.first._M_dataplus._M_p +
                 (long)(_Rb_tree_color *)local_a0.first._M_string_length);
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar5 == 0) {
        bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_70);
        if (bVar4) {
          (local_118->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
          *(undefined4 *)
           &(local_118->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = 0x3f800000;
          syntactic::ParamSet::getParamTexture((ParamSet *)local_b0,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_108,(SP *)local_e0);
          uVar3 = local_108._8_8_;
          uVar2 = local_108._0_8_;
          local_108._0_8_ = (element_type *)0x0;
          local_108._8_8_ = (element_type *)0x0;
          this_00 = (local_118->integrator).
                    super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (local_118->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
          (local_118->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)uVar3;
          if (this_00 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          this_02 = (_Base_ptr)local_b0._8_8_;
          if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
            this_02 = (_Base_ptr)local_b0._8_8_;
          }
          goto LAB_001458a8;
        }
        syntactic::ParamSet::getParam3f
                  ((ParamSet *)*in_RDX,
                   (float *)&(local_118->film).
                             super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_70);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar5 == 0) {
          bVar4 = syntactic::ParamSet::hasParam1f((ParamSet *)*in_RDX,&local_70);
          if (!bVar4) {
            syntactic::ParamSet::getParamTexture((ParamSet *)local_c0,(string *)*in_RDX);
            findOrCreateTexture((SemanticParser *)local_108,(SP *)local_e0);
            uVar3 = local_108._8_8_;
            uVar2 = local_108._0_8_;
            local_108._0_8_ = (element_type *)0x0;
            local_108._8_8_ = (element_type *)0x0;
            p_Var1 = (local_118->pixelFilter).
                     super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            (local_118->pixelFilter).
            super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar2;
            (local_118->pixelFilter).
            super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            this_02 = (_Base_ptr)local_c0._8_8_;
            if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
              this_02 = (_Base_ptr)local_c0._8_8_;
            }
            goto LAB_001458a8;
          }
          fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_70,0.0);
          *(float *)&(local_118->integrator).
                     super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi = fVar11;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)&local_70);
            if (iVar5 != 0) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_50,"un-handled matte-material parameter \'",&local_a0.first);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_108._0_8_ = *plVar6;
              peVar7 = (element_type *)(plVar6 + 2);
              if ((element_type *)local_108._0_8_ == peVar7) {
                local_108._16_8_ = (peVar7->super_Entity)._vptr_Entity;
                _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[3];
                local_108._0_8_ = (element_type *)(local_108 + 0x10);
              }
              else {
                local_108._16_8_ = (peVar7->super_Entity)._vptr_Entity;
              }
              local_108._8_8_ = plVar6[1];
              *plVar6 = (long)peVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::runtime_error::runtime_error(this_01,(string *)local_108);
              __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            syntactic::ParamSet::getParamTexture((ParamSet *)local_d0,(string *)*in_RDX);
            findOrCreateTexture((SemanticParser *)local_108,(SP *)local_e0);
            uVar3 = local_108._8_8_;
            uVar2 = local_108._0_8_;
            local_108._0_8_ = (element_type *)0x0;
            local_108._8_8_ = (element_type *)0x0;
            p_Var1 = (local_118->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (local_118->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar2;
            (local_118->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            this_02 = (_Base_ptr)local_d0._8_8_;
            if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
              this_02 = (_Base_ptr)local_d0._8_8_;
            }
LAB_001458a8:
            if (this_02 != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_a0.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
        operator_delete(local_a0.first._M_dataplus._M_p);
      }
      auVar12 = std::_Rb_tree_increment(p_Var10);
      _Var8._M_pi = auVar12._8_8_;
      p_Var10 = auVar12._0_8_;
    } while (p_Var10 != p_Var9);
  }
  (local_d8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_d8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_118;
  (local_d8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_110._M_pi;
  SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  return (SP)SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_matte(pbrt::syntactic::Material::SP in)
  {
    MatteMaterial::SP mat = std::make_shared<MatteMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "sigma") {
        if (in->hasParam1f(name))
          mat->sigma = in->getParam1f(name);
        else 
          mat->map_sigma = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      } else
        throw std::runtime_error("un-handled matte-material parameter '"+it.first+"'");
    };
    return mat;
  }